

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.c
# Opt level: O2

int inform_bin_step(double *series,size_t n,double step,int *binned,inform_error *err)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  double dVar4;
  double dVar5;
  double max;
  double min;
  
  if (series != (double *)0x0) {
    if (n == 0) {
      if (err == (inform_error *)0x0) {
        return 0;
      }
      *err = INFORM_ESHORTSERIES;
      return 0;
    }
    if (step <= 2.220446049250313e-15) {
      if (err == (inform_error *)0x0) {
        return 0;
      }
      *err = INFORM_EBIN;
      return 0;
    }
    if (binned != (int *)0x0) {
      dVar4 = inform_range(series,n,&min,&max,err);
      dVar5 = ceil(dVar4 / step);
      dVar4 = fmod(dVar4,step);
      iVar2 = (int)dVar5 + (uint)(dVar4 == 0.0);
      sVar3 = 0;
      do {
        if (n == sVar3) {
          return iVar2;
        }
        dVar4 = floor((series[sVar3] - min) / step);
        iVar1 = (int)dVar4;
        binned[sVar3] = iVar1;
      } while ((-1 < iVar1) && (sVar3 = sVar3 + 1, iVar1 < iVar2));
      __assert_fail("0 <= binned[i] && binned[i] < b",
                    "/workspace/llm4binary/github/license_c_cmakelists/ELIFE-ASU[P]Inform/src/utilities/binning.c"
                    ,0x51,
                    "int inform_bin_step(const double *, size_t, double, int *, inform_error *)");
    }
  }
  if (err != (inform_error *)0x0) {
    *err = INFORM_ETIMESERIES;
  }
  return 0;
}

Assistant:

int inform_bin_step(double const *series, size_t n, double step, int *binned,
    inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0);
    else if (step <= 10.*DBL_EPSILON)
        INFORM_ERROR_RETURN(err, INFORM_EBIN, 0);
    else if (binned == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);

    double min, max;
    double range = inform_range(series, n, &min, &max, err);
    int b = (int) ceil(range / step);

    if (fmod(range,step) == 0.0) ++b;

    for (size_t i = 0; i < n; ++i)
    {
        binned[i] = (int) floor((series[i] - min) / step);
        assert(0 <= binned[i] && binned[i] < b);
    }

    return b;
}